

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O0

Btree tree_5_3::search_(Btree t,int e)

{
  Btree pnVar1;
  int e_local;
  Btree t_local;
  
  if (t != (Btree)0x0) {
    if (t->data == e) {
      return t;
    }
    if (e < t->data) {
      pnVar1 = search_(t->left,e);
      return pnVar1;
    }
    if (t->data < e) {
      pnVar1 = search_(t->right,e);
      return pnVar1;
    }
  }
  return (Btree)0x0;
}

Assistant:

Btree search_(Btree t, int e) {
        if (t != nullptr) {
            if (t->data == e)
                return t;
            if (t->data > e)
                return search_(t->left, e);
            if (t->data < e)
                return search_(t->right, e);
        }
        return nullptr;
    }